

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformation_t * opengv::absolute_pose::gpnp(AbsoluteAdapterBase *adapter,Indices *indices)

{
  double dVar1;
  double dVar2;
  Scalar SVar3;
  Scalar SVar4;
  ulong uVar5;
  long *plVar6;
  int iVar7;
  size_t sVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  Indices *in_RDX;
  long *in_RSI;
  transformation_t *in_RDI;
  ReturnType RVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar19;
  Matrix<double,_12,_1,_0,_12,_1> a;
  MatrixXd pinvA;
  MatrixXd V;
  size_t i_4;
  MatrixXd D;
  MatrixXd invD;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD2;
  bearingVector_t f;
  rotation_t camRotation;
  translation_t camOffset;
  size_t i_3;
  MatrixXd b;
  MatrixXd A;
  Vector3d temp;
  size_t i_2;
  MatrixXd weights;
  double e3dote3;
  Vector3d e3;
  double e2dote2;
  Vector3d e2;
  double e1dote1;
  Vector3d e1;
  points_t c;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  size_t i_1;
  MatrixXd p;
  size_t i;
  point_t c0;
  transformation_t *transformation;
  transformation_t *in_stack_00008cc8;
  points_t *in_stack_00008cd0;
  Matrix<double,_12,_12,_0,_12,_12> *in_stack_00008cd8;
  Matrix<double,_12,_1,_0,_12,_1> *in_stack_00008ce0;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffe980;
  undefined4 in_stack_ffffffffffffe988;
  int in_stack_ffffffffffffe98c;
  Indices *in_stack_ffffffffffffe990;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffe998;
  int *in_stack_ffffffffffffe9a0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffe9a8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffe9b0;
  undefined8 in_stack_ffffffffffffe9b8;
  MatrixType *in_stack_ffffffffffffe9c0;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_ffffffffffffe9c8;
  double *in_stack_ffffffffffffe9d0;
  unsigned_long *in_stack_ffffffffffffe9d8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffe9e0;
  ulong local_be8;
  undefined1 local_978 [24];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_960;
  undefined1 local_938 [72];
  undefined1 local_8f0 [24];
  ulong local_8d8;
  ulong local_820;
  size_t local_818;
  undefined4 local_80c;
  ReturnType local_7f0;
  ReturnType local_7b8;
  ReturnType local_780;
  undefined8 local_710;
  undefined8 local_5e8;
  undefined8 local_4c0;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_3d0 [26];
  undefined1 local_160 [64];
  ulong local_120;
  size_t local_118;
  undefined4 local_10c;
  size_t local_f0;
  undefined1 local_c8 [48];
  ulong local_98;
  Indices *local_68;
  long *local_60;
  
  local_68 = in_RDX;
  local_60 = in_RSI;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_ffffffffffffe980);
  local_98 = 0;
  while( true ) {
    uVar5 = local_98;
    sVar8 = Indices::size(local_68);
    plVar6 = local_60;
    if (sVar8 <= uVar5) break;
    iVar7 = Indices::operator[](in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
    (**(code **)(*plVar6 + 0x30))(local_c8,plVar6,(long)iVar7);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_ffffffffffffe980);
    local_98 = local_98 + 1;
  }
  local_f0 = Indices::size(local_68);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9d8);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_ffffffffffffe980);
  local_10c = 3;
  local_118 = Indices::size(local_68);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffe9a8,
             in_stack_ffffffffffffe9a0,(unsigned_long *)in_stack_ffffffffffffe998);
  local_120 = 0;
  while( true ) {
    uVar5 = local_120;
    sVar8 = Indices::size(local_68);
    plVar6 = local_60;
    if (sVar8 <= uVar5) break;
    iVar7 = Indices::operator[](in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
    (**(code **)(*plVar6 + 0x30))(local_160,plVar6,(long)iVar7);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_ffffffffffffe998,(Index)in_stack_ffffffffffffe990);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_ffffffffffffe980);
    local_120 = local_120 + 1;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
             (uint)((ulong)in_stack_ffffffffffffe9b8 >> 0x20));
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x714978);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)in_stack_ffffffffffffe998,(value_type *)in_stack_ffffffffffffe990);
  local_4c0 = 0x402e000000000000;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_ffffffffffffe998,(Index)in_stack_ffffffffffffe990);
  Eigen::operator*(in_stack_ffffffffffffe9d0,(StorageBaseType *)in_stack_ffffffffffffe9c8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_ffffffffffffe9b0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
              *)in_stack_ffffffffffffe9a8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
              *)in_stack_ffffffffffffe980);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
              (value_type *)in_stack_ffffffffffffe980);
  local_5e8 = 0x402e000000000000;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_ffffffffffffe998,(Index)in_stack_ffffffffffffe990);
  Eigen::operator*(in_stack_ffffffffffffe9d0,(StorageBaseType *)in_stack_ffffffffffffe9c8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_ffffffffffffe9b0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
              *)in_stack_ffffffffffffe9a8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
              *)in_stack_ffffffffffffe980);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
              (value_type *)in_stack_ffffffffffffe980);
  local_710 = 0x402e000000000000;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_ffffffffffffe998,(Index)in_stack_ffffffffffffe990);
  Eigen::operator*(in_stack_ffffffffffffe9d0,(StorageBaseType *)in_stack_ffffffffffffe9c8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_ffffffffffffe9b0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
              *)in_stack_ffffffffffffe9a8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
              *)in_stack_ffffffffffffe980);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
              (value_type *)in_stack_ffffffffffffe980);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](local_3d0,1);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_ffffffffffffe980);
  local_780 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              dot<Eigen::Matrix<double,3,1,0,3,1>>
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_ffffffffffffe980);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](local_3d0,2);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_ffffffffffffe980);
  local_7b8 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              dot<Eigen::Matrix<double,3,1,0,3,1>>
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_ffffffffffffe980);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](local_3d0,3);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_ffffffffffffe980);
  local_7f0 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              dot<Eigen::Matrix<double,3,1,0,3,1>>
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_ffffffffffffe980);
  local_80c = 4;
  local_818 = Indices::size(local_68);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffe9a8,
             in_stack_ffffffffffffe9a0,(unsigned_long *)in_stack_ffffffffffffe998);
  local_820 = 0;
  while( true ) {
    uVar5 = local_820;
    sVar8 = Indices::size(local_68);
    if (sVar8 <= uVar5) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_ffffffffffffe998,(Index)in_stack_ffffffffffffe990);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               in_stack_ffffffffffffe980);
    RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Matrix<double,3,1,0,3,1>>
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffe980);
    dVar12 = RVar11 / local_780;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x714e1f);
    *pSVar9 = dVar12;
    RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Matrix<double,3,1,0,3,1>>
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffe980);
    dVar12 = RVar11 / local_7b8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x714e97);
    *pSVar9 = dVar12;
    RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Matrix<double,3,1,0,3,1>>
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffe980);
    dVar12 = RVar11 / local_7f0;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x714f0f);
    *pSVar9 = dVar12;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x714f48);
    dVar12 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x714f81);
    dVar1 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x714fc7);
    dVar2 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715018);
    *pSVar9 = 1.0 - (dVar12 + dVar1 + dVar2);
    local_820 = local_820 + 1;
  }
  Indices::size(local_68);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_ffffffffffffe990,
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_ffffffffffffe980);
  Indices::size(local_68);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_ffffffffffffe990,
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_ffffffffffffe980);
  local_8d8 = 0;
  while( true ) {
    uVar5 = local_8d8;
    sVar8 = Indices::size(local_68);
    plVar6 = local_60;
    if (sVar8 <= uVar5) break;
    iVar7 = Indices::operator[](in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
    (**(code **)(*plVar6 + 0x20))(local_8f0,plVar6,(long)iVar7);
    plVar6 = local_60;
    iVar7 = Indices::operator[](in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
    (**(code **)(*plVar6 + 0x28))(local_938,plVar6,(long)iVar7);
    plVar6 = local_60;
    iVar7 = Indices::operator[](in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
    (**(code **)(*plVar6 + 0x10))(local_978,plVar6,(long)iVar7);
    PVar19 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffe980);
    local_960 = PVar19;
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffe980);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x7152ee);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715367);
    *pSVar9 = dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x71539f);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715425);
    *pSVar9 = -dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x71545e);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x7154d8);
    *pSVar9 = dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715511);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715597);
    *pSVar9 = -dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x7155d0);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x71564a);
    *pSVar9 = dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715683);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715709);
    *pSVar9 = -dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715742);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x7157bc);
    *pSVar9 = dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x7157f5);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x71587b);
    *pSVar9 = -dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x7158b3);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x71592f);
    *pSVar9 = dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715967);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x7159f0);
    *pSVar9 = -dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715a29);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715aa5);
    *pSVar9 = dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715ade);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715b67);
    *pSVar9 = -dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715ba0);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715c1c);
    *pSVar9 = dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715c55);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715cde);
    *pSVar9 = -dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715d17);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715d93);
    *pSVar9 = dVar12 * dVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715dcc);
    dVar12 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar1 = *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715e55);
    *pSVar9 = -dVar12 * dVar1;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    SVar3 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    SVar4 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar12 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = SVar3;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SVar4;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar12 * *pSVar10;
    auVar13 = vfmsub213sd_fma(auVar13,auVar15,auVar17);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x715f76);
    *pSVar9 = auVar13._0_8_;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    SVar3 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    SVar4 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    dVar12 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (Index)in_stack_ffffffffffffe980);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = SVar3;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SVar4;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar12 * *pSVar10;
    auVar13 = vfmsub213sd_fma(auVar14,auVar16,auVar18);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x71609b);
    *pSVar9 = auVar13._0_8_;
    local_8d8 = local_8d8 + 1;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
             (uint)((ulong)in_stack_ffffffffffffe9b8 >> 0x20));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_ffffffffffffe990,
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_ffffffffffffe980);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::singularValues
            ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),in_stack_ffffffffffffe980
            );
  for (local_be8 = 0; local_be8 < 0xc; local_be8 = local_be8 + 1) {
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                        (Index)in_stack_ffffffffffffe980,0x7161b1);
    if (*pSVar9 <= 1e-06) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                          (Index)in_stack_ffffffffffffe980,0x7162a1);
      *pSVar9 = 0.0;
    }
    else {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                          (Index)in_stack_ffffffffffffe980,0x7161ec);
      dVar12 = 1.0 / *pSVar9;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                          (Index)in_stack_ffffffffffffe980,0x716226);
      *pSVar9 = dVar12;
    }
  }
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffe980);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffe980);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffe980);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
               *)in_stack_ffffffffffffe998,
              (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
              in_stack_ffffffffffffe990);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)in_stack_ffffffffffffe980);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffe980);
  Eigen::Matrix<double,12,1,0,12,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((Matrix<double,_12,_1,_0,_12,_1> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)in_stack_ffffffffffffe980);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x7163fa);
  Eigen::Matrix<double,12,12,0,12,12>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,_12,_12,_0,_12,_12> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffe980);
  modules::gpnp_main(in_stack_00008ce0,in_stack_00008cd8,in_stack_00008cd0,in_stack_00008cc8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x716447);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x716454);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x716461);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x71646e);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x716488);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x716495);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x7164a2);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_ffffffffffffe998);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x7164c9);
  return in_RDI;
}

Assistant:

transformation_t gpnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  assert( indices.size() > 5 );

  //compute the centroid
  point_t c0 = Eigen::Vector3d::Zero();
  for( size_t i = 0; i < indices.size(); i++ )
    c0 = c0 + adapter.getPoint(indices[i]);
  c0 = c0 / indices.size();

  //compute the point-cloud
  Eigen::MatrixXd p(3,indices.size());
  for( size_t i = 0; i < indices.size(); i++ )
    p.col(i) = adapter.getPoint(indices[i]) - c0;

  //compute the moment
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      p,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  //define the control points
  points_t c;
  c.push_back(c0);
  //c.push_back(c0 + SVD.singularValues()[0] * SVD.matrixU().col(0));
  //c.push_back(c0 + SVD.singularValues()[1] * SVD.matrixU().col(1));
  //c.push_back(c0 + SVD.singularValues()[2] * SVD.matrixU().col(2));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(0));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(1));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(2));

  //derive the barycentric frame
  Eigen::Vector3d e1 = c[1]-c0;
  double e1dote1 = e1.dot(e1);
  Eigen::Vector3d e2 = c[2]-c0;
  double e2dote2 = e2.dot(e2);
  Eigen::Vector3d e3 = c[3]-c0;
  double e3dote3 = e3.dot(e3);

  //derive the weighting factors
  Eigen::MatrixXd weights(4,indices.size());
  for( size_t i = 0; i < indices.size(); i++ )
  {
    Eigen::Vector3d temp = p.col(i);
    weights(1,i) = temp.dot(e1)/e1dote1;
    weights(2,i) = temp.dot(e2)/e2dote2;
    weights(3,i) = temp.dot(e3)/e3dote3;
    weights(0,i) = 1.0-(weights(1,i)+weights(2,i)+weights(3,i));
  }

  //setup matrix A and vector b
  Eigen::MatrixXd A = Eigen::MatrixXd::Zero(2*indices.size(),12);
  Eigen::MatrixXd b = Eigen::MatrixXd::Zero(2*indices.size(),1);
  for( size_t i = 0; i < indices.size(); i++ )
  {
    translation_t camOffset = adapter.getCamOffset(indices[i]);
    rotation_t camRotation = adapter.getCamRotation(indices[i]);
    //respect the rotation
    bearingVector_t f = camRotation * adapter.getBearingVector(indices[i]);

    A(2*i,0)  =  weights(0,i)*f[2];
    A(2*i,2)  = -weights(0,i)*f[0];
    A(2*i,3)  =  weights(1,i)*f[2];
    A(2*i,5)  = -weights(1,i)*f[0];
    A(2*i,6)  =  weights(2,i)*f[2];
    A(2*i,8)  = -weights(2,i)*f[0];
    A(2*i,9)  =  weights(3,i)*f[2];
    A(2*i,11) = -weights(3,i)*f[0];

    A(2*i+1,1)  =  weights(0,i)*f[2];
    A(2*i+1,2)  = -weights(0,i)*f[1];
    A(2*i+1,4)  =  weights(1,i)*f[2];
    A(2*i+1,5)  = -weights(1,i)*f[1];
    A(2*i+1,7)  =  weights(2,i)*f[2];
    A(2*i+1,8)  = -weights(2,i)*f[1];
    A(2*i+1,10) =  weights(3,i)*f[2];
    A(2*i+1,11) = -weights(3,i)*f[1];

    b(2*i,0)   = f[2]*camOffset[0]-f[0]*camOffset[2];
    b(2*i+1,0) = f[2]*camOffset[1]-f[1]*camOffset[2];
  }

  //computing the SVD
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD2(
      A,
      Eigen::ComputeThinV | Eigen::ComputeThinU );

  //computing the pseudoinverse
  Eigen::MatrixXd invD = Eigen::MatrixXd::Zero(12,12);
  Eigen::MatrixXd D = SVD2.singularValues();
  for( size_t i = 0; i < 12; i++ )
  {
    if( D(i,0) > 1.e-6 )
      invD(i,i) = 1.0/D(i,0);
    else
      invD(i,i) = 0.0;
  }

  //Extract the nullsapce vectors;
  Eigen::MatrixXd V = SVD2.matrixV();

  //computing the nullspace intercept
  Eigen::MatrixXd pinvA = V * invD * SVD2.matrixU().transpose();

  //compute the intercept
  Eigen::Matrix<double,12,1> a = pinvA * b;

  //compute the solution
  transformation_t transformation;
  modules::gpnp_main( a, V, c, transformation );
  return transformation;
}